

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::SubstrateMaterial::SubstrateMaterial(SubstrateMaterial *this,string *name)

{
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffc8;
  Material *in_stack_ffffffffffffffd0;
  
  Material::Material(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *in_RDI = &PTR_toString_abi_cxx11__002183b0;
  *(undefined4 *)(in_RDI + 7) = 0x3dcccccd;
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x12dac6);
  *(undefined4 *)(in_RDI + 10) = 0x3dcccccd;
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x12dae0);
  *(undefined1 *)(in_RDI + 0xd) = 1;
  math::vec3f::vec3f((vec3f *)((long)in_RDI + 0x6c),0.5);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x12db0f);
  math::vec3f::vec3f((vec3f *)(in_RDI + 0x11),0.5);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x12db3b);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x12db4c);
  return;
}

Assistant:

SubstrateMaterial(const std::string &name = "") : Material(name) {}